

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getInjectionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  
  ppVar2 = getHandleInfo(this,handle);
  psVar4 = (string *)&gEmptyString_abi_cxx11_;
  if (ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    cVar1 = *(char *)((long)&(ppVar2->first)._M_string_length + 4);
    if (cVar1 == 'e') {
      psVar4 = (string *)&(ppVar2->second).field_2;
    }
    else if (cVar1 == 'f') {
      psVar4 = (string *)ppVar2[1].second.field_2._M_allocated_capacity;
    }
    else if (cVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar2->first)._M_string_length);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getInjectionType_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return psVar4;
}

Assistant:

const std::string& CommonCore::getInjectionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionType();
                }
                break;
            }
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_in;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}